

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec.c
# Opt level: O1

void tetra_decode(tetra_codec *st,uint8_t *coded,int16_t *pcm,int bfi)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int16_t parm [24];
  int16_t serial [138];
  Word16 aWStack_168 [24];
  ushort local_138 [144];
  
  local_138[0] = (ushort)(bfi != 0);
  lVar3 = 1;
  uVar4 = 7;
  do {
    local_138[lVar3] = (ushort)((*coded >> (uVar4 & 0x1f) & 1) != 0);
    bVar1 = (int)uVar4 < 1;
    bVar2 = (int)uVar4 < 1;
    uVar4 = uVar4 - 1;
    if (bVar2) {
      uVar4 = 7;
    }
    coded = coded + bVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x8a);
  Bits2prm_Tetra(st,(Word16 *)local_138,aWStack_168);
  Decod_Tetra(st,aWStack_168,pcm);
  Post_Process(st,pcm,0xf0);
  return;
}

Assistant:

void tetra_decode(tetra_codec* st, const uint8_t* coded, int16_t* pcm, int bfi)
{
	int16_t serial[1 + CODED_FRAME_BIT_COUNT];
	serial[0] = bfi ? 1 : 0;
	unpack_coded_bits(coded, serial + 1);

	int16_t parm[24];
	Bits2prm_Tetra(st, serial, parm);

	Decod_Tetra(st, parm, pcm);

	Post_Process(st, pcm, TSC_L_frame);
}